

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Serial.cpp
# Opt level: O2

bool __thiscall axl::io::Serial::getSettings(Serial *this,SerialSettings *settings)

{
  bool bVar1;
  termios attr;
  termios local_4c;
  
  bVar1 = psx::Serial::getAttr(&this->m_serial,&local_4c);
  if (bVar1) {
    SerialSettings::setAttr(settings,&local_4c);
  }
  return bVar1;
}

Assistant:

bool
Serial::getSettings(SerialSettings* settings) {
	termios attr;
	bool result = m_serial.getAttr(&attr);
	if (!result)
		return false;

	settings->setAttr(&attr);
	return true;
}